

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O2

void __thiscall
matrix_sparse_element_test_inequality_comparison_Test::
matrix_sparse_element_test_inequality_comparison_Test
          (matrix_sparse_element_test_inequality_comparison_Test *this)

{
  matrix_sparse_element_test::matrix_sparse_element_test(&this->super_matrix_sparse_element_test);
  (this->super_matrix_sparse_element_test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00155058
  ;
  return;
}

Assistant:

TEST_F(matrix_sparse_element_test, inequality_comparison) {
  element_type same_element(&column_index, &value);
  EXPECT_FALSE(*element != same_element);

  int different_column = 6;
  double different_value = 2.71;
  element_type different_element(&different_column, &different_value);
  EXPECT_TRUE(*element != different_element);
}